

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::RelationFromQuery(Connection *this,string *query,string *alias,string *error)

{
  type context;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  string *in_R8;
  shared_ptr<duckdb::Relation,_true> sVar2;
  undefined1 local_50 [8];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)query);
  QueryRelation::ParseStatement((QueryRelation *)local_50,context,alias,in_R8);
  local_48 = (element_type *)&stack0xffffffffffffffc8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_4f001a4 + 9);
  sVar2 = RelationFromQuery(this,(unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                                  *)query,(string *)local_50,error);
  _Var1._M_pi = sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_48 != (element_type *)&stack0xffffffffffffffc8) {
    operator_delete(local_48);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_50 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_50 + 8))();
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Connection::RelationFromQuery(const string &query, const string &alias, const string &error) {
	return RelationFromQuery(QueryRelation::ParseStatement(*context, query, error), alias);
}